

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DOMRangeImpl::setStartAfter(DOMRangeImpl *this,DOMNode *refNode)

{
  DOMDocument *pDVar1;
  bool bVar2;
  int iVar3;
  DOMNode *n;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DOMNode *pDVar4;
  DOMException *this_00;
  code *pcVar5;
  pointer_____offset_0x10___ *ppuVar6;
  DOMRangeImpl *this_01;
  XMLSize_t XVar7;
  
  if (this->fDetached == true) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMException::DOMException(this_00,0xb,0,this->fMemoryManager);
LAB_00287120:
    ppuVar6 = &DOMException::typeinfo;
    pcVar5 = DOMException::~DOMException;
  }
  else {
    this_01 = this;
    bVar2 = hasLegalRootContainer(this,refNode);
    if (bVar2) {
      bVar2 = isLegalContainedNode(this_01,refNode);
      if (bVar2) {
        pDVar1 = this->fDocument;
        iVar3 = (*refNode->_vptr_DOMNode[0xc])(refNode);
        if (pDVar1 == (DOMDocument *)CONCAT44(extraout_var,iVar3)) {
LAB_0028702a:
          iVar3 = (*refNode->_vptr_DOMNode[5])(refNode);
          this->fStartContainer = (DOMNode *)CONCAT44(extraout_var_00,iVar3);
          XVar7 = 0;
          pDVar4 = refNode;
          while (pDVar4 != (DOMNode *)0x0) {
            XVar7 = XVar7 + 1;
            iVar3 = (*pDVar4->_vptr_DOMNode[9])(pDVar4);
            pDVar4 = (DOMNode *)CONCAT44(extraout_var_01,iVar3);
          }
          this->fStartOffset = XVar7;
          pDVar4 = commonAncestorOf(this,refNode,this->fEndContainer);
          if (pDVar4 == (DOMNode *)0x0) {
            (*(this->super_DOMRange)._vptr_DOMRange[0xe])(this,1);
          }
          iVar3 = (*(this->super_DOMRange)._vptr_DOMRange[0x11])(this,3,this);
          if ((short)iVar3 == 1) {
            (*(this->super_DOMRange)._vptr_DOMRange[0xe])(this,1);
            return;
          }
          this->fCollapsed = false;
          return;
        }
        pDVar4 = &this->fDocument->super_DOMNode;
        if (this->fDocument == (DOMDocument *)0x0) {
          pDVar4 = (DOMNode *)0x0;
        }
        if (pDVar4 == refNode) goto LAB_0028702a;
        (*(this->super_DOMRange)._vptr_DOMRange[0xe])(this,1);
        this->fCollapsed = true;
        this_00 = (DOMException *)__cxa_allocate_exception(0x28);
        DOMException::DOMException(this_00,4,0,this->fMemoryManager);
        goto LAB_00287120;
      }
    }
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMRangeException::DOMRangeException((DOMRangeException *)this_00,0x70,0,this->fMemoryManager);
    ppuVar6 = &DOMRangeException::typeinfo;
    pcVar5 = DOMRangeException::~DOMRangeException;
  }
  __cxa_throw(this_00,ppuVar6,pcVar5);
}

Assistant:

void DOMRangeImpl::setStartAfter(const DOMNode* refNode)
{
    if( fDetached) {
        throw DOMException(
            DOMException::INVALID_STATE_ERR, 0, fMemoryManager);
    }
    if ( !hasLegalRootContainer(refNode) || !isLegalContainedNode(refNode)) {
        throw DOMRangeException(
            DOMRangeException::INVALID_NODE_TYPE_ERR, 0, fMemoryManager);
    }

    // error if not the same owner document
    if (fDocument != refNode->getOwnerDocument()) {
        if ( refNode != fDocument ) {
            collapse(true); //collapse the range positions to start
            fCollapsed = true;
            throw DOMException(
                DOMException::WRONG_DOCUMENT_ERR, 0, fMemoryManager);
        }
    }

    fStartContainer = refNode->getParentNode();
    XMLSize_t i = 0;
    for (DOMNode* n = (DOMNode*) refNode; n!=0; n = n->getPreviousSibling()) {
        i++;
    }

    fStartOffset = i;

    // they may be of same document, but not same root container
    // collapse if not the same root container
    if (!commonAncestorOf(refNode, fEndContainer))
        collapse(true);

    //compare the start and end boundary point
    //collapse if start point is after the end point
    if(compareBoundaryPoints(DOMRange::END_TO_START, this) == 1)
        collapse(true); //collapse the range positions to start
    else
        fCollapsed = false;
}